

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

int json_object_update_existing(json_t *object,json_t *other)

{
  char *iter;
  void *iter_00;
  char *key;
  size_t key_len;
  json_t *value;
  json_t *pjVar1;
  int iVar2;
  char *iter_01;
  
  iVar2 = -1;
  if ((((object != (json_t *)0x0) && (other != (json_t *)0x0)) && (object->type == JSON_OBJECT)) &&
     (other->type == JSON_OBJECT)) {
    iter_00 = json_object_iter(other);
    iVar2 = 0;
    while( true ) {
      key = json_object_iter_key(iter_00);
      iter = key + -0x28;
      iter_01 = iter;
      if (key == (char *)0x0) {
        iter_01 = (char *)0x0;
      }
      key_len = json_object_iter_key_len(iter_01);
      if (key == (char *)0x0) break;
      value = json_object_iter_value(iter);
      if (value == (json_t *)0x0) {
        return 0;
      }
      pjVar1 = json_object_getn(object,key,key_len);
      if (pjVar1 != (json_t *)0x0) {
        json_object_setn_new_nocheck(object,key,key_len,value);
      }
      iter_00 = json_object_iter_next(other,iter);
    }
  }
  return iVar2;
}

Assistant:

int json_object_update_existing(json_t *object, json_t *other) {
    const char *key;
    size_t key_len;
    json_t *value;

    if (!json_is_object(object) || !json_is_object(other))
        return -1;

    json_object_keylen_foreach(other, key, key_len, value) {
        if (json_object_getn(object, key, key_len))
            json_object_setn_nocheck(object, key, key_len, value);
    }

    return 0;
}